

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_query_result.cpp
# Opt level: O0

void __thiscall
duckdb::ArrowQueryResult::ArrowQueryResult
          (ArrowQueryResult *this,StatementType statement_type,StatementProperties *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names_p,vector<duckdb::LogicalType,_true> *types_p,ClientProperties *client_properties,
          idx_t batch_size)

{
  undefined8 *in_RDI;
  undefined8 in_stack_00000008;
  StatementProperties *in_stack_fffffffffffffe78;
  StatementProperties *in_stack_fffffffffffffe80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff80;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff88;
  StatementProperties *in_stack_ffffffffffffff90;
  StatementType in_stack_ffffffffffffff9e;
  QueryResultType in_stack_ffffffffffffff9f;
  QueryResult *in_stack_ffffffffffffffa0;
  ClientProperties *in_stack_ffffffffffffffb0;
  
  StatementProperties::StatementProperties(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe80,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe78);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffe80,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffe78);
  ClientProperties::ClientProperties
            ((ClientProperties *)in_stack_fffffffffffffe80,
             (ClientProperties *)in_stack_fffffffffffffe78);
  QueryResult::QueryResult
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffffb0);
  ClientProperties::~ClientProperties((ClientProperties *)0x1527dff);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x1527e0c);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1527e19);
  StatementProperties::~StatementProperties(in_stack_fffffffffffffe80);
  *in_RDI = &PTR__ArrowQueryResult_03527468;
  vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
            *)0x1527e45);
  in_RDI[0x34] = in_stack_00000008;
  return;
}

Assistant:

ArrowQueryResult::ArrowQueryResult(StatementType statement_type, StatementProperties properties, vector<string> names_p,
                                   vector<LogicalType> types_p, ClientProperties client_properties, idx_t batch_size)
    : QueryResult(QueryResultType::ARROW_RESULT, statement_type, std::move(properties), std::move(types_p),
                  std::move(names_p), std::move(client_properties)),
      batch_size(batch_size) {
}